

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resFilter.c
# Opt level: O1

int Res_FilterCandidatesArea
              (Res_Win_t *pWin,Abc_Ntk_t *pAig,Res_Sim_t *pSim,Vec_Vec_t *vResubs,
              Vec_Vec_t *vResubsW,int nFaninsMax)

{
  long lVar1;
  void **ppvVar2;
  Abc_Obj_t *pNode;
  void *pvVar3;
  void *Entry;
  byte bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pAVar10;
  uint uVar11;
  long lVar12;
  int Level;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  
  if (pSim->vOuts->nSize < 2) {
LAB_004655d1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar19 = (ulong)(uint)pSim->nWordsOut;
  do {
    iVar7 = (int)uVar19;
    if (iVar7 < 1) goto LAB_00464f3f;
    lVar12 = uVar19 * 4;
    uVar19 = uVar19 - 1;
  } while (*(int *)((long)pSim->vOuts->pArray[1] + lVar12 + -4) == -1);
  if (iVar7 < 1) {
LAB_00464f3f:
    puVar8 = Res_FilterCollectFaninInfo(pWin,pSim,0xffffffff);
    uVar19 = (ulong)(uint)pSim->nWordsOut;
    do {
      iVar7 = (int)uVar19;
      if (iVar7 < 1) goto LAB_00464f77;
      lVar12 = uVar19 - 1;
      uVar19 = uVar19 - 1;
    } while (puVar8[lVar12] == 0xffffffff);
    if (iVar7 < 1) {
LAB_00464f77:
      iVar7 = vResubs->nSize;
      if (0 < (long)iVar7) {
        ppvVar2 = vResubs->pArray;
        lVar12 = 0;
        do {
          *(undefined4 *)((long)ppvVar2[lVar12] + 4) = 0;
          lVar12 = lVar12 + 1;
        } while (iVar7 != lVar12);
      }
      iVar7 = vResubsW->nSize;
      if (0 < (long)iVar7) {
        ppvVar2 = vResubsW->pArray;
        lVar12 = 0;
        do {
          *(undefined4 *)((long)ppvVar2[lVar12] + 4) = 0;
          lVar12 = lVar12 + 1;
        } while (iVar7 != lVar12);
      }
      pAVar10 = pWin->pNode;
      if ((pAVar10->vFanins).nSize < 1) {
        uVar17 = 0xffffffff;
      }
      else {
        uVar19 = 0xffffffff;
        uVar21 = 0;
        iVar7 = 0;
        do {
          pNode = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[uVar21]];
          if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) && ((pNode->vFanouts).nSize < 2)) {
            iVar6 = Res_WinVisitMffc(pNode);
            if (iVar7 < iVar6) {
              uVar19 = uVar21 & 0xffffffff;
            }
            if (iVar7 <= iVar6) {
              iVar7 = iVar6;
            }
          }
          uVar17 = (uint)uVar19;
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)(pAVar10->vFanins).nSize);
      }
      if (uVar17 != 0xffffffff) {
        bVar4 = (byte)uVar17 & 0x1f;
        puVar8 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
        uVar19 = (ulong)(uint)pSim->nWordsOut;
        do {
          iVar7 = (int)uVar19;
          if (iVar7 < 1) goto LAB_0046550e;
          lVar12 = uVar19 - 1;
          uVar19 = uVar19 - 1;
        } while (puVar8[lVar12] == 0xffffffff);
        if (iVar7 < 1) {
LAB_0046550e:
          if (0 < pAig->vPos->nSize) {
            Vec_VecPush(vResubs,0,*pAig->vPos->pArray);
            if (1 < pAig->vPos->nSize) {
              Vec_VecPush(vResubs,0,pAig->vPos->pArray[1]);
              pAVar10 = pWin->pNode;
              if ((pAVar10->vFanins).nSize < 1) {
                return 1;
              }
              uVar19 = 0;
              do {
                if (uVar17 != uVar19) {
                  if (pAig->vPos->nSize <= (int)uVar19 + 2) break;
                  pvVar3 = pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[uVar19]];
                  Vec_VecPush(vResubs,0,pAig->vPos->pArray[uVar19 + 2]);
                  Vec_VecPush(vResubsW,0,pvVar3);
                }
                uVar19 = uVar19 + 1;
                pAVar10 = pWin->pNode;
                if ((long)(pAVar10->vFanins).nSize <= (long)uVar19) {
                  return 1;
                }
              } while( true );
            }
          }
        }
        else {
          iVar7 = (pWin->pNode->vFanins).nSize;
          uVar11 = iVar7 + 2;
          pVVar9 = pAig->vPos;
          iVar6 = pVVar9->nSize;
          Level = 0;
          if ((int)uVar11 < iVar6) {
            uVar19 = (ulong)uVar11;
            Level = 0;
            do {
              if (iVar7 < -2) goto LAB_004655d1;
              iVar18 = (int)uVar19;
              if (pSim->vOuts->nSize <= iVar18) goto LAB_004655d1;
              uVar11 = (iVar18 - (pWin->pNode->vFanins).nSize) - 2;
              uVar21 = (ulong)(uint)pSim->nWordsOut;
              do {
                iVar13 = (int)uVar21;
                if (iVar13 < 1) goto LAB_0046511c;
                lVar12 = uVar21 * 4;
                lVar1 = uVar21 - 1;
                uVar21 = uVar21 - 1;
              } while ((*(uint *)((long)pSim->vOuts->pArray[uVar19] + lVar12 + -4) | puVar8[lVar1])
                       == 0xffffffff);
              if (iVar13 < 1) {
LAB_0046511c:
                if (iVar6 < 1) goto LAB_004655d1;
                Vec_VecPush(vResubs,Level,*pVVar9->pArray);
                if (pAig->vPos->nSize < 2) goto LAB_004655d1;
                Vec_VecPush(vResubs,Level,pAig->vPos->pArray[1]);
                pAVar10 = pWin->pNode;
                if (0 < (pAVar10->vFanins).nSize) {
                  uVar21 = 0;
                  do {
                    if (uVar17 != uVar21) {
                      if (pAig->vPos->nSize <= (int)uVar21 + 2) goto LAB_004655d1;
                      pvVar3 = pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[uVar21]];
                      Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar21 + 2]);
                      Vec_VecPush(vResubsW,Level,pvVar3);
                    }
                    uVar21 = uVar21 + 1;
                    pAVar10 = pWin->pNode;
                  } while ((long)uVar21 < (long)(pAVar10->vFanins).nSize);
                }
                if (((pAig->vPos->nSize <= iVar18) ||
                    (Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar19]), (int)uVar11 < 0)) ||
                   (pWin->vDivs->nSize <= (int)uVar11)) goto LAB_004655d1;
                Vec_VecPush(vResubsW,Level,pWin->vDivs->pArray[uVar11]);
                Level = Level + 1;
                if (Level == vResubs->nSize) break;
              }
              uVar19 = uVar19 + 1;
              pVVar9 = pAig->vPos;
              iVar6 = pVVar9->nSize;
            } while ((int)uVar19 < iVar6);
          }
          if (0 < Level) {
            return Level;
          }
          iVar7 = (pWin->pNode->vFanins).nSize;
          if (nFaninsMax <= iVar7) {
            return Level;
          }
          uVar21 = (ulong)(iVar7 + 3);
          uVar19 = (ulong)(iVar7 + 2U);
          while( true ) {
            iVar6 = (int)uVar19;
            if (pAig->vPos->nSize <= iVar6) {
              return Level;
            }
            if (((int)(iVar7 + 2U) < 0) || (pSim->vOuts->nSize <= iVar6)) break;
            pVVar9 = pAig->vPos;
            iVar18 = pVVar9->nSize;
            if ((int)(uVar19 + 1) < iVar18) {
              pvVar3 = pSim->vOuts->pArray[uVar19];
              uVar11 = (iVar6 - (pWin->pNode->vFanins).nSize) - 2;
              uVar20 = uVar21;
              do {
                if ((int)uVar21 < 0) goto LAB_004655d1;
                iVar13 = (int)uVar20;
                if (pSim->vOuts->nSize <= iVar13) goto LAB_004655d1;
                uVar16 = (iVar13 - (pWin->pNode->vFanins).nSize) - 2;
                uVar15 = (ulong)(uint)pSim->nWordsOut;
                do {
                  iVar14 = (int)uVar15;
                  if (iVar14 < 1) goto LAB_00465355;
                  lVar12 = uVar15 * 4;
                  lVar5 = uVar15 - 1;
                  lVar1 = uVar15 * 4;
                  uVar15 = uVar15 - 1;
                } while ((*(uint *)((long)pvVar3 + lVar12 + -4) | puVar8[lVar5] |
                         *(uint *)((long)pSim->vOuts->pArray[uVar20] + lVar1 + -4)) == 0xffffffff);
                if (iVar14 < 1) {
LAB_00465355:
                  if (iVar18 < 1) goto LAB_004655d1;
                  Vec_VecPush(vResubs,Level,*pVVar9->pArray);
                  if (pAig->vPos->nSize < 2) goto LAB_004655d1;
                  Vec_VecPush(vResubs,Level,pAig->vPos->pArray[1]);
                  pAVar10 = pWin->pNode;
                  if (0 < (pAVar10->vFanins).nSize) {
                    uVar15 = 0;
                    do {
                      if (uVar17 != uVar15) {
                        if (pAig->vPos->nSize <= (int)uVar15 + 2) goto LAB_004655d1;
                        Entry = pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[uVar15]];
                        Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar15 + 2]);
                        Vec_VecPush(vResubsW,Level,Entry);
                      }
                      uVar15 = uVar15 + 1;
                      pAVar10 = pWin->pNode;
                    } while ((long)uVar15 < (long)(pAVar10->vFanins).nSize);
                  }
                  if (pAig->vPos->nSize <= iVar6) goto LAB_004655d1;
                  Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar19]);
                  if (((pAig->vPos->nSize <= iVar13) ||
                      (Vec_VecPush(vResubs,Level,pAig->vPos->pArray[uVar20]), (int)uVar11 < 0)) ||
                     ((pWin->vDivs->nSize <= (int)uVar11 ||
                      ((Vec_VecPush(vResubsW,Level,pWin->vDivs->pArray[uVar11]), (int)uVar16 < 0 ||
                       (pWin->vDivs->nSize <= (int)uVar16)))))) goto LAB_004655d1;
                  Vec_VecPush(vResubsW,Level,pWin->vDivs->pArray[uVar16]);
                  Level = Level + 1;
                  if (Level == vResubs->nSize) break;
                }
                uVar20 = uVar20 + 1;
                pVVar9 = pAig->vPos;
                iVar18 = pVVar9->nSize;
              } while ((int)uVar20 < iVar18);
            }
            uVar21 = uVar21 + 1;
            uVar19 = uVar19 + 1;
            if (Level == vResubs->nSize) {
              return Level;
            }
          }
        }
        goto LAB_004655d1;
      }
    }
  }
  return 0;
}

Assistant:

int Res_FilterCandidatesArea( Res_Win_t * pWin, Abc_Ntk_t * pAig, Res_Sim_t * pSim, Vec_Vec_t * vResubs, Vec_Vec_t * vResubsW, int nFaninsMax )
{
    Abc_Obj_t * pFanin;
    unsigned * pInfo, * pInfoDiv, * pInfoDiv2;
    int Counter, RetValue, d, d2, k, iDiv, iDiv2, iBest;

    // check that the info the node is one
    pInfo = (unsigned *)Vec_PtrEntry( pSim->vOuts, 1 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 1!\n" );
        return 0;
    }

    // collect the fanin info
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~0 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 2!\n" );
        return 0;
    }

    // try removing fanins
//    printf( "Fanins: " );
    Counter = 0;
    Vec_VecClear( vResubs );
    Vec_VecClear( vResubsW );
    // get the best fanins
    iBest = Res_FilterCriticalFanin( pWin->pNode );
    if ( iBest == -1 )
        return 0;

    // get the info without the critical fanin
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << iBest) );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue )
    {
//        printf( "Can be done without one!\n" );
        // collect the nodes
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
        Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
        {
            if ( k != iBest )
            {
                Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                Vec_VecPush( vResubsW, Counter, pFanin );
            }
        }
        Counter++;
//        printf( "*" );
        return Counter;
    }

    // go through the divisors
    for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
    {
        pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
        iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
        if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
            continue;
//if ( Abc_ObjLevel(pWin->pNode) <= Abc_ObjLevel( Vec_PtrEntry(pWin->vDivs, iDiv) ) )
//    printf( "Node level = %d. Divisor level = %d.\n", Abc_ObjLevel(pWin->pNode), Abc_ObjLevel( Vec_PtrEntry(pWin->vDivs, iDiv) ) );
        // collect the nodes
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
        // collect the remaning fanins and the divisor
        Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
        {
            if ( k != iBest )
            {
                Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                Vec_VecPush( vResubsW, Counter, pFanin );
            }
        }
        // collect the divisor
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
        Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
        Counter++;

        if ( Counter == Vec_VecSize(vResubs) )
            break;            
    }

    if ( Counter > 0 || Abc_ObjFaninNum(pWin->pNode) >= nFaninsMax )
        return Counter;

    // try to find the node pairs
    for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
    {
        pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
        iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
        // go through the second divisor
        for ( d2 = d + 1; d2 < Abc_NtkPoNum(pAig); d2++ )
        {
            pInfoDiv2 = (unsigned *)Vec_PtrEntry( pSim->vOuts, d2 );
            iDiv2 = d2 - (Abc_ObjFaninNum(pWin->pNode) + 2);

            if ( !Abc_InfoIsOrOne3( pInfo, pInfoDiv, pInfoDiv2, pSim->nWordsOut ) )
                continue;
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            // collect the remaning fanins and the divisor
            Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
            {
                if ( k != iBest )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFanin );
                }
            }
            // collect the divisor
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d2) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv2) );
            Counter++;

            if ( Counter == Vec_VecSize(vResubs) )
                break;            
        }
        if ( Counter == Vec_VecSize(vResubs) )
            break;            
    }
    return Counter;
}